

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.cpp
# Opt level: O3

IAnimatedMesh * __thiscall
irr::scene::COBJMeshFileLoader::createMesh(COBJMeshFileLoader *this,IReadFile *file)

{
  pointer *ppSVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  iterator __position;
  bool bVar7;
  _Alloc_hider _Var8;
  undefined1 *puVar9;
  _Alloc_hider _Var10;
  char cVar11;
  char cVar12;
  int iVar13;
  undefined4 extraout_var;
  SObjMtl *pSVar14;
  undefined4 extraout_var_00;
  byte *inBuf;
  long *plVar15;
  ulong uVar16;
  iterator iVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  unsigned_short *puVar19;
  pointer piVar20;
  long lVar21;
  byte *pbVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  long *plVar24;
  long lVar25;
  undefined **ppuVar26;
  SAnimatedMesh *this_00;
  ulong uVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 *puVar31;
  SMeshBuffer *pSVar32;
  SMeshBuffer *pSVar33;
  char *pcVar34;
  char *vec;
  iterator iVar35;
  COBJMeshFileLoader *this_01;
  byte *pbVar36;
  byte *bufEnd;
  u32 i;
  _Alloc_hider _Var37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  ulong uVar39;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 uVar40;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 uVar41;
  double __x;
  undefined4 extraout_XMM0_Db_04;
  SObjMtl *currMtl;
  int vertLocation;
  s32 Idx [3];
  array<int> faceCorners;
  array<irr::core::vector3d<float>_> normalsBuffer;
  array<irr::core::vector3d<float>_> vertexBuffer;
  array<irr::core::vector2d<float>_> textureCoordBuffer;
  stringc wordBuffer;
  stringc mtlName;
  stringc grpName;
  stringc TAG_OFF;
  path fullName;
  c8 name [512];
  SObjMtl *local_3c8;
  int local_3c0;
  int local_3bc [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3b0;
  COBJMeshFileLoader *local_3a8;
  uint local_39c;
  key_type local_398;
  byte *local_370;
  array<int> local_368;
  vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_> local_348;
  undefined1 local_330;
  vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_> local_328;
  undefined1 local_310;
  array<irr::core::vector2d<float>_> local_308;
  long *local_2e0;
  stringc local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  string<char> local_278;
  undefined1 *local_258;
  undefined8 local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [31];
  
  if (file != (IReadFile *)0x0) {
    iVar13 = (*file->_vptr_IReadFile[2])(file);
    lVar21 = CONCAT44(extraout_var,iVar13);
    if (lVar21 != 0) {
      local_328.
      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_328.
      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (vector3d<float> *)0x0;
      local_328.
      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (vector3d<float> *)0x0;
      local_310 = 1;
      ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
      reserve(&local_328,1000);
      local_348.
      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (vector3d<float> *)0x0;
      local_348.
      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.
      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (vector3d<float> *)0x0;
      local_330 = 1;
      ::std::vector<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>::
      reserve(&local_348,1000);
      local_308.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_308.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_308.m_data.
      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_308.is_sorted = true;
      ::std::vector<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>::
      reserve(&local_308.m_data,1000);
      pSVar14 = (SObjMtl *)operator_new(0x80);
      SObjMtl::SObjMtl(pSVar14);
      local_2e0 = (long *)&(this->super_IMeshLoader).field_0x10;
      local_3c8 = pSVar14;
      core::array<irr::scene::COBJMeshFileLoader::SObjMtl_*>::push_back
                ((array<irr::scene::COBJMeshFileLoader::SObjMtl_*> *)local_2e0,&local_3c8);
      iVar13 = (*file->_vptr_IReadFile[4])(file);
      local_258 = &local_248;
      local_250 = 0;
      local_248 = 0;
      if (&local_258 != (undefined1 **)CONCAT44(extraout_var_00,iVar13)) {
        ::std::__cxx11::string::_M_assign((string *)&local_258);
      }
      inBuf = (byte *)operator_new__(lVar21 + 1U);
      memset(inBuf,0,lVar21 + 1U);
      (**file->_vptr_IReadFile)(file,inBuf,lVar21);
      bufEnd = inBuf + lVar21;
      local_298._M_allocated_capacity = (size_type)&local_288;
      local_298._8_8_ = 0;
      local_288._M_local_buf[0] = '\0';
      local_2b8._M_allocated_capacity = (size_type)&local_2a8;
      local_2b8._8_8_ = 0;
      local_2a8._M_local_buf[0] = '\0';
      plVar15 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xd8))();
      cVar11 = (**(code **)(*plVar15 + 0x98))(plVar15,"OBJ_IgnoreGroups",0);
      plVar15 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xd8))();
      cVar12 = (**(code **)(*plVar15 + 0x98))(plVar15,"OBJ_IgnoreMaterialFiles",0);
      local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (int *)0x0;
      local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = (int *)0x0;
      local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_368.is_sorted = true;
      core::array<int>::reallocate(&local_368,0x20,true);
      local_278.str._M_dataplus._M_p = (pointer)&local_278.str.field_2;
      local_278.str._M_string_length = 0;
      local_278.str.field_2._M_local_buf[0] = '\0';
      pcVar34 = "off";
      core::string<char>::operator=(&local_278,"off");
      this_00 = (SAnimatedMesh *)0x0;
      local_39c = 0;
      local_3a8 = this;
      local_370 = inBuf;
LAB_001b31fe:
      vec = (char *)&local_238;
      bVar28 = *inBuf;
      switch(bVar28) {
      case 0x6d:
        if (cVar12 == '\0') goto switchD_001b3219_caseD_73;
        break;
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x74:
        break;
      case 0x73:
switchD_001b3219_caseD_73:
        inBuf = (byte *)goAndCopyNextWord(this,vec,(c8 *)inBuf,0x200,(c8 *)bufEnd);
        pcVar34 = vec;
        break;
      case 0x75:
        inBuf = (byte *)goAndCopyNextWord(this,vec,(c8 *)inBuf,0x200,(c8 *)bufEnd);
        paVar23 = &local_2b8;
LAB_001b3346:
        core::string<char>::operator=((string<char> *)paVar23,vec);
        pcVar34 = vec;
LAB_001b334b:
        this_00 = (SAnimatedMesh *)0x1;
        break;
      case 0x76:
        bVar28 = inBuf[1];
        if (bVar28 == 0x74) {
          local_238._M_allocated_capacity = 0;
          inBuf = (byte *)readUV(this,(c8 *)inBuf,(vector2df *)vec,(c8 *)bufEnd);
          core::array<irr::core::vector2d<float>_>::push_back(&local_308,(vector2d<float> *)vec);
          pcVar34 = vec;
        }
        else if (bVar28 == 0x6e) {
          local_238._M_allocated_capacity = 0;
          local_238._8_4_ = 0.0;
          inBuf = (byte *)readVec3(this,(c8 *)inBuf,(vector3df *)vec,(c8 *)bufEnd);
          pcVar34 = (char *)local_348.
                            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          if (local_348.
              super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_348.
              super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>::
            _M_realloc_insert<irr::core::vector3d<float>const&>
                      ((vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>
                        *)&local_348,
                       (iterator)
                       local_348.
                       super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(vector3d<float> *)vec);
          }
          else {
            (local_348.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->Z = (float)local_238._8_4_;
            (local_348.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->X =
                 (float)local_238._M_allocated_capacity._0_4_;
            (local_348.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->Y =
                 (float)local_238._M_allocated_capacity._4_4_;
            local_348.
            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_348.
                 super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_330 = 0;
        }
        else if (bVar28 == 0x20) {
          local_238._M_allocated_capacity = 0;
          local_238._8_4_ = 0.0;
          inBuf = (byte *)readVec3(this,(c8 *)inBuf,(vector3df *)vec,(c8 *)bufEnd);
          pcVar34 = (char *)local_328.
                            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          if (local_328.
              super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_328.
              super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>::
            _M_realloc_insert<irr::core::vector3d<float>const&>
                      ((vector<irr::core::vector3d<float>,std::allocator<irr::core::vector3d<float>>>
                        *)&local_328,
                       (iterator)
                       local_328.
                       super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(vector3d<float> *)vec);
          }
          else {
            (local_328.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->Z = (float)local_238._8_4_;
            (local_328.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->X =
                 (float)local_238._M_allocated_capacity._0_4_;
            (local_328.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->Y =
                 (float)local_238._M_allocated_capacity._4_4_;
            local_328.
            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_328.
                 super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          local_310 = 0;
        }
        break;
      default:
        if (bVar28 != 0x66) {
          if (bVar28 == 0x67) {
            pcVar34 = vec;
            inBuf = (byte *)goAndCopyNextWord(this,vec,(c8 *)inBuf,0x200,(c8 *)bufEnd);
            if (cVar11 == '\0') {
              if (local_238._M_local_buf[0] == '\0') {
                vec = "default";
              }
              paVar23 = &local_298;
              goto LAB_001b3346;
            }
            goto LAB_001b334b;
          }
          break;
        }
        local_398.Normal.Y = 0.0;
        local_398.Normal.Z = 0.0;
        local_398.Pos._0_8_ = (void *)0x0;
        local_398.Pos.Z = 0.0;
        local_398.Normal.X = 0.0;
        local_398.Color.color = 0xffffffff;
        local_398.TCoords.X = 0.0;
        local_398.TCoords.Y = 0.0;
        if (this_00 == (SAnimatedMesh *)0x0) {
LAB_001b3399:
          pSVar14 = local_3c8;
          if (local_3c8 != (SObjMtl *)0x0) goto LAB_001b33a3;
        }
        else {
          pcVar34 = (char *)&local_2b8;
          pSVar14 = findMtl(this,(stringc *)pcVar34,(stringc *)&local_298);
          if (pSVar14 == (SObjMtl *)0x0) goto LAB_001b3399;
LAB_001b33a3:
          local_3c8 = pSVar14;
          local_398.Color.color = (local_3c8->Meshbuffer->Material).DiffuseColor.color;
        }
        copyLine(&local_2d8,(COBJMeshFileLoader *)pcVar34,(c8 *)inBuf,(c8 *)bufEnd);
        _Var10._M_p = local_2d8.str._M_dataplus._M_p;
        puVar31 = (undefined1 *)(ulong)(uint)local_2d8.str._M_string_length;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_2d8.str._M_dataplus._M_p + (long)puVar31);
        pcVar34 = (char *)0x0;
        ::std::vector<int,_std::allocator<int>_>::resize(&local_368.m_data,0);
        local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var10._M_p;
        _Var37._M_p = _Var10._M_p;
        _Var8._M_p = _Var10._M_p;
        for (puVar9 = puVar31; puVar9 != (undefined1 *)0x0; puVar9 = puVar9 + -1) {
          if (((ulong)(byte)*_Var8._M_p < 0x21) &&
             ((0x100003e00U >> ((ulong)(byte)*_Var8._M_p & 0x3f) & 1) != 0)) {
            _Var37._M_p = _Var8._M_p + (long)puVar9;
            pcVar34 = (char *)0x0;
            goto LAB_001b3779;
          }
          _Var8._M_p = _Var8._M_p + 1;
          _Var37._M_p = (pointer)paVar23;
        }
        goto LAB_001b341d;
      }
      goto switchD_001b3219_caseD_6e;
    }
  }
  return (IAnimatedMesh *)(SAnimatedMesh *)0x0;
  while (pcVar34 = (char *)((long)pcVar34 + 1), puVar9 != pcVar34) {
LAB_001b3779:
    bVar28 = _Var8._M_p[(long)pcVar34];
    if ((4 < bVar28 - 9) && (bVar28 != 0x20)) {
      _Var37._M_p = _Var8._M_p + (long)pcVar34;
      goto LAB_001b3420;
    }
  }
LAB_001b341d:
  bVar28 = *_Var37._M_p;
LAB_001b3420:
  uVar40 = extraout_XMM0_Da;
  uVar41 = extraout_XMM0_Db;
  if (bVar28 != 0) {
    local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(_Var10._M_p + (long)puVar31);
LAB_001b342d:
    local_3bc[2] = -1;
    local_3bc[0] = -1;
    local_3bc[1] = -1;
    uVar39 = 0;
    this_01 = (COBJMeshFileLoader *)0x100003e01;
    while( true ) {
      uVar29 = (uint)uVar39;
      if ((((ulong)(byte)_Var37._M_p[uVar39] < 0x21) &&
          ((0x100003e01U >> ((ulong)(byte)_Var37._M_p[uVar39] & 0x3f) & 1) != 0)) ||
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(_Var37._M_p + uVar39) == paVar23)) break;
      uVar39 = (ulong)(uVar29 + 1);
    }
    uVar27 = 0x1ff;
    if (uVar29 < 0x1ff) {
      uVar27 = uVar39;
    }
    if (uVar29 == 0) {
      uVar16 = 0;
    }
    else {
      if (0x1fe < uVar39) {
        uVar39 = 0x1ff;
      }
      uVar30 = 0;
      do {
        this_01 = (COBJMeshFileLoader *)CONCAT71((int7)((ulong)this_01 >> 8),_Var37._M_p[uVar30]);
        local_238._M_local_buf[uVar30] = _Var37._M_p[uVar30];
        uVar30 = uVar30 + 1;
        uVar16 = uVar27;
      } while (uVar39 != uVar30);
    }
    local_238._M_local_buf[uVar16] = '\0';
    retrieveVertexIndices
              (this_01,local_238._M_local_buf,local_3bc,local_238._M_local_buf + uVar27 + 1,
               (int)((ulong)((long)local_328.
                                   super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_328.
                                  super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555,
               (u32)((ulong)((long)local_308.m_data.
                                   super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_308.m_data.
                                  super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
               (int)((ulong)((long)local_348.
                                   super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_348.
                                  super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555);
    lVar21 = (long)local_3bc[0];
    uVar40 = extraout_XMM0_Da_00;
    uVar41 = extraout_XMM0_Db_00;
    if ((-1 < lVar21) &&
       (iVar13 = (int)((ulong)((long)local_328.
                                     super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_328.
                                    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 2),
       SBORROW4(local_3bc[0],iVar13 * -0x55555555) != local_3bc[0] + iVar13 * 0x55555555 < 0)) {
      local_398.Pos.Z =
           local_328.
           super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
           ._M_impl.super__Vector_impl_data._M_start[lVar21].Z;
      local_398.Pos._0_8_ =
           *(undefined8 *)
            (local_328.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar21);
      local_398.TCoords.X = 0.0;
      local_398.TCoords.Y = 0.0;
      if ((-1 < (long)local_3bc[1]) &&
         (local_3bc[1] <
          (int)((ulong)((long)local_308.m_data.
                              super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_308.m_data.
                             super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
        local_398.TCoords.X =
             local_308.m_data.
             super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_3bc[1]].X;
        local_398.TCoords.Y =
             local_308.m_data.
             super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_3bc[1]].Y;
      }
      lVar21 = (long)local_3bc[2];
      if ((lVar21 < 0) ||
         (iVar13 = (int)((ulong)((long)local_348.
                                       super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_348.
                                      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
         SBORROW4(local_3bc[2],iVar13 * -0x55555555) == local_3bc[2] + iVar13 * 0x55555555 < 0)) {
        local_398.Normal.X = 0.0;
        local_398.Normal.Y = 0.0;
        local_398.Normal.Z = 0.0;
        local_3c8->RecalculateNormals = true;
      }
      else {
        local_398.Normal.Z =
             local_348.
             super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar21].Z;
        uVar5 = local_348.
                super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar21].X;
        uVar6 = local_348.
                super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar21].Y;
        local_398.Normal.X = (float)uVar5;
        local_398.Normal.Y = (float)uVar6;
      }
      iVar17 = ::std::
               _Rb_tree<irr::video::S3DVertex,_std::pair<const_irr::video::S3DVertex,_int>,_std::_Select1st<std::pair<const_irr::video::S3DVertex,_int>_>,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
               ::find((_Rb_tree<irr::video::S3DVertex,_std::pair<const_irr::video::S3DVertex,_int>,_std::_Select1st<std::pair<const_irr::video::S3DVertex,_int>_>,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
                       *)local_3c8,&local_398);
      if ((_Rb_tree_header *)iVar17._M_node ==
          &(local_3c8->VertMap)._M_t._M_impl.super__Rb_tree_header) {
        pSVar32 = local_3c8->Meshbuffer;
        __position._M_current =
             (pSVar32->Vertices).m_data.
             super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pSVar32->Vertices).m_data.
            super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<irr::video::S3DVertex,std::allocator<irr::video::S3DVertex>>::
          _M_realloc_insert<irr::video::S3DVertex_const&>
                    ((vector<irr::video::S3DVertex,std::allocator<irr::video::S3DVertex>> *)
                     &pSVar32->Vertices,__position,&local_398);
        }
        else {
          ((__position._M_current)->TCoords).Y = local_398.TCoords.Y;
          ((__position._M_current)->Normal).Y = local_398.Normal.Y;
          ((__position._M_current)->Normal).Z = local_398.Normal.Z;
          (__position._M_current)->Color = (SColor)local_398.Color.color;
          ((__position._M_current)->TCoords).X = local_398.TCoords.X;
          ((__position._M_current)->Pos).X = local_398.Pos.X;
          ((__position._M_current)->Pos).Y = local_398.Pos.Y;
          *(ulong *)&((__position._M_current)->Pos).Z = CONCAT44(local_398.Normal.X,local_398.Pos.Z)
          ;
          ppSVar1 = &(pSVar32->Vertices).m_data.
                     super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        (pSVar32->Vertices).is_sorted = false;
        local_3c0 = (int)((ulong)((long)(local_3c8->Meshbuffer->Vertices).m_data.
                                        super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(local_3c8->Meshbuffer->Vertices).m_data.
                                       super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39
                    + -1;
        ::std::
        _Rb_tree<irr::video::S3DVertex,std::pair<irr::video::S3DVertex_const,int>,std::_Select1st<std::pair<irr::video::S3DVertex_const,int>>,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
        ::_M_emplace_unique<irr::video::S3DVertex&,int&>
                  ((_Rb_tree<irr::video::S3DVertex,std::pair<irr::video::S3DVertex_const,int>,std::_Select1st<std::pair<irr::video::S3DVertex_const,int>>,std::less<irr::video::S3DVertex>,std::allocator<std::pair<irr::video::S3DVertex_const,int>>>
                    *)local_3c8,&local_398,&local_3c0);
        uVar40 = extraout_XMM0_Da_02;
        uVar41 = extraout_XMM0_Db_02;
      }
      else {
        local_3c0 = *(int *)&iVar17._M_node[2].field_0x4;
        uVar40 = extraout_XMM0_Da_01;
        uVar41 = extraout_XMM0_Db_01;
      }
      if (local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        pcVar34 = (char *)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
        ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_368,
                   (iterator)
                   local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_3c0);
        uVar40 = extraout_XMM0_Da_03;
        uVar41 = extraout_XMM0_Db_03;
      }
      else {
        *local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish = local_3c0;
        pcVar34 = (char *)(local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1);
        local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)pcVar34;
      }
      local_368.is_sorted = false;
      paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var37._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var37._M_p != paVar23) {
        lVar21 = (long)local_3b0 - (long)_Var37._M_p;
        do {
          if (((ulong)(byte)*_Var37._M_p < 0x21) &&
             ((0x100003e00U >> ((ulong)(byte)*_Var37._M_p & 0x3f) & 1) != 0)) {
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)_Var37._M_p + lVar21);
            goto LAB_001b371b;
          }
          _Var37._M_p = _Var37._M_p + 1;
          lVar21 = lVar21 + -1;
          paVar38 = paVar23;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)_Var37._M_p != paVar23);
      }
      goto LAB_001b373b;
    }
    goto LAB_001b37b5;
  }
LAB_001b3745:
  if ((uint)((ulong)((long)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2) < 3) {
LAB_001b37b5:
    pcVar34 = local_2d8.str._M_dataplus._M_p;
    os::Printer::log((double)CONCAT44(uVar41,uVar40));
    operator_delete__(local_370);
    this = local_3a8;
    cleanUp(local_3a8);
    bVar7 = false;
  }
  else {
    iVar13 = *local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar39 = 1;
    local_3b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_3b0._4_4_,iVar13);
    piVar20 = local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    this = local_3a8;
    do {
      iVar3 = piVar20[uVar39];
      iVar4 = piVar20[uVar39 + 1];
      if (((iVar4 == iVar3) || (iVar4 == iVar13)) || (iVar3 == iVar13)) {
        local_39c = local_39c + 1;
      }
      else {
        pSVar32 = local_3c8->Meshbuffer;
        iVar35._M_current =
             (pSVar32->Indices).m_data.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        puVar19 = (pSVar32->Indices).m_data.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        if (iVar35._M_current == puVar19) {
          local_3bc[0]._0_2_ = (unsigned_short)iVar4;
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>
                    (&(pSVar32->Indices).m_data,iVar35,(unsigned_short *)local_3bc);
          pSVar33 = local_3c8->Meshbuffer;
          iVar35._M_current =
               (pSVar33->Indices).m_data.
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar19 = (pSVar33->Indices).m_data.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar35._M_current = (unsigned_short)iVar4;
          iVar35._M_current = iVar35._M_current + 1;
          (pSVar32->Indices).m_data.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar35._M_current;
          pSVar33 = pSVar32;
        }
        (pSVar32->Indices).is_sorted = false;
        local_3bc[0]._0_2_ = (unsigned_short)iVar3;
        if (iVar35._M_current == puVar19) {
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>
                    (&(pSVar33->Indices).m_data,iVar35,(unsigned_short *)local_3bc);
          pSVar32 = local_3c8->Meshbuffer;
          pcVar34 = (char *)(pSVar32->Indices).m_data.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
          puVar19 = (pSVar32->Indices).m_data.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar35._M_current = (unsigned_short)local_3bc[0];
          pcVar34 = (char *)(iVar35._M_current + 1);
          (pSVar33->Indices).m_data.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pcVar34;
          pSVar32 = pSVar33;
        }
        iVar13 = (int)local_3b0;
        (pSVar33->Indices).is_sorted = false;
        local_3bc[0]._0_2_ = (unsigned_short)local_3b0;
        if ((unsigned_short *)pcVar34 == puVar19) {
          ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>
                    (&(pSVar32->Indices).m_data,(iterator)pcVar34,(unsigned_short *)local_3bc);
        }
        else {
          *(unsigned_short *)pcVar34 = (unsigned_short)local_3b0;
          pcVar34 = (char *)((long)pcVar34 + 2);
          (pSVar32->Indices).m_data.
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)pcVar34;
        }
        (pSVar32->Indices).is_sorted = false;
        piVar20 = local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        this = local_3a8;
      }
      uVar39 = uVar39 + 1;
    } while (uVar39 < (int)((ulong)((long)paVar23 - (long)piVar20) >> 2) - 1);
    bVar7 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.str._M_dataplus._M_p != &local_2d8.str.field_2) {
    pcVar34 = (char *)(local_2d8.str.field_2._M_allocated_capacity + 1);
    operator_delete(local_2d8.str._M_dataplus._M_p,(ulong)pcVar34);
  }
  this_00 = (SAnimatedMesh *)0x0;
  if (!bVar7) goto LAB_001b3d59;
switchD_001b3219_caseD_6e:
  pbVar36 = inBuf;
  if (inBuf != bufEnd) {
    lVar21 = (long)bufEnd - (long)inBuf;
    do {
      if ((*inBuf == 10) || (*inBuf == 0xd)) {
        pbVar22 = inBuf + lVar21;
        goto LAB_001b3a53;
      }
      inBuf = inBuf + 1;
      lVar21 = lVar21 + -1;
      pbVar36 = bufEnd;
    } while (inBuf != bufEnd);
  }
LAB_001b3a74:
  inBuf = pbVar36;
  if (pbVar36 == bufEnd) {
    if (local_39c != 0) {
      core::string<char>::string((string<char> *)&local_238,local_39c);
      ::std::__cxx11::string::append(local_238._M_local_buf,0x22aa81);
      local_398.Pos.Z = 0.0;
      local_398.Normal.X = 0.0;
      local_398.Normal.Y = (float)((uint)local_398.Normal.Y & 0xffffff00);
      local_398.Pos._0_8_ = (void *)((long)&local_398 + 0x10U);
      ::std::__cxx11::string::_M_assign((string *)&local_398);
      __x = (double)::std::__cxx11::string::_M_append(local_238._M_local_buf,local_398.Pos._0_8_);
      if ((void *)local_398.Pos._0_8_ != (void *)((long)&local_398 + 0x10U)) {
        operator_delete((void *)local_398.Pos._0_8_,
                        CONCAT44(local_398.Normal.Z,local_398.Normal.Y) + 1);
        __x = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
      }
      os::Printer::log((Printer *)local_238._M_allocated_capacity,__x);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_allocated_capacity != local_228) {
        operator_delete((void *)local_238._M_allocated_capacity,
                        local_228[0]._M_allocated_capacity + 1);
      }
    }
    paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)operator_new(0x58);
    plVar15 = local_2e0;
    *(char *)((long)paVar23 + 0x48) = '\0';
    *(char *)((long)paVar23 + 0x49) = '\0';
    *(char *)((long)paVar23 + 0x4a) = '\0';
    *(char *)((long)paVar23 + 0x4b) = '\0';
    *(char *)((long)paVar23 + 0x4c) = '\0';
    *(char *)((long)paVar23 + 0x4d) = '\0';
    *(char *)((long)paVar23 + 0x4e) = '\0';
    *(char *)((long)paVar23 + 0x4f) = '\0';
    *(char *)((long)paVar23 + 0x50) = '\x01';
    *(char *)((long)paVar23 + 0x51) = '\0';
    *(char *)((long)paVar23 + 0x52) = '\0';
    *(char *)((long)paVar23 + 0x53) = '\0';
    ppuVar26 = &PTR_getMeshBufferCount_00260610;
    paVar23->_M_allocated_capacity = (size_type)&PTR_getMeshBufferCount_00260610;
    *(undefined ***)(paVar23->_M_local_buf + 0x40) = &PTR__SMesh_00260680;
    *(undefined8 *)((long)paVar23 + 8) = 0;
    paVar23[1]._M_allocated_capacity = 0;
    *(undefined8 *)((long)paVar23 + 0x18) = 0;
    paVar23->_M_local_buf[0x20] = '\x01';
    (((aabbox3d<float> *)(paVar23->_M_local_buf + 0x28))->MinEdge).X = -1.0;
    (((aabbox3d<float> *)(paVar23->_M_local_buf + 0x28))->MinEdge).Y = -1.0;
    *(undefined8 *)(paVar23->_M_local_buf + 0x30) = 0x3f800000bf800000;
    *(undefined8 *)(paVar23->_M_local_buf + 0x38) = 0x3f8000003f800000;
    lVar21 = *(long *)&(this->super_IMeshLoader).field_0x10;
    if ((int)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar21) >> 3) != 0) {
      uVar39 = 0;
      do {
        iVar13 = (**(code **)(**(long **)(*(long *)(lVar21 + uVar39 * 8) + 0x30) + 0x48))();
        lVar21 = *plVar15;
        if (iVar13 != 0) {
          (**(code **)(**(long **)(*(long *)(lVar21 + uVar39 * 8) + 0x30) + 0x60))();
          lVar21 = *plVar15;
          lVar25 = *(long *)(lVar21 + uVar39 * 8);
          if (*(char *)(lVar25 + 0x7d) == '\x01') {
            plVar24 = (long *)(**(code **)(**(long **)&(this->super_IMeshLoader).field_0x8 + 0xb8))
                                        ();
            (**(code **)(*plVar24 + 8))
                      (plVar24,*(undefined8 *)
                                (*(long *)(*(long *)&(this->super_IMeshLoader).field_0x10 +
                                          uVar39 * 8) + 0x30),0,0);
            lVar21 = *(long *)&(this->super_IMeshLoader).field_0x10;
            lVar25 = *(long *)(lVar21 + uVar39 * 8);
          }
          local_238._M_allocated_capacity = *(long *)(lVar25 + 0x30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_allocated_capacity !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            piVar2 = (int *)(local_238._M_allocated_capacity +
                            *(long *)(*local_238._M_allocated_capacity - 0x18) + 0x10);
            *piVar2 = *piVar2 + 1;
            core::array<irr::scene::IMeshBuffer_*>::push_back
                      ((array<irr::scene::IMeshBuffer_*> *)((long)paVar23 + 8),
                       (IMeshBuffer **)&local_238._M_allocated_capacity);
            lVar21 = *plVar15;
          }
        }
        uVar39 = uVar39 + 1;
      } while (uVar39 < ((ulong)(*(long *)&(this->super_IMeshLoader).field_0x18 - lVar21) >> 3 &
                        0xffffffff));
      ppuVar26 = *(undefined ***)paVar23;
    }
    iVar13 = (*(code *)*ppuVar26)(paVar23);
    if (iVar13 == 0) {
      this_00 = (SAnimatedMesh *)0x0;
    }
    else {
      SMesh::recalculateBoundingBox((SMesh *)paVar23);
      this_00 = (SAnimatedMesh *)operator_new(0x60);
      *(undefined8 *)&this_00->field_0x50 = 0;
      *(undefined4 *)&this_00->field_0x58 = 1;
      *(undefined8 *)this_00 = 0x260770;
      *(undefined8 *)&this_00->field_0x48 = 0x2607f8;
      (this_00->Meshes).m_data.
      super__Vector_base<irr::scene::IMesh_*,_std::allocator<irr::scene::IMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this_00->Meshes).m_data.
      super__Vector_base<irr::scene::IMesh_*,_std::allocator<irr::scene::IMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this_00->Meshes).m_data.
      super__Vector_base<irr::scene::IMesh_*,_std::allocator<irr::scene::IMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (this_00->Meshes).is_sorted = true;
      (this_00->Box).MinEdge.X = -1.0;
      (this_00->Box).MinEdge.Y = -1.0;
      *(undefined8 *)&(this_00->Box).MinEdge.Z = 0x3f800000bf800000;
      (this_00->Box).MaxEdge.Y = 1.0;
      (this_00->Box).MaxEdge.Z = 1.0;
      this_00->FramesPerSecond = 25.0;
      this_00->Type = EAMT_UNKNOWN;
      SAnimatedMesh::recalculateBoundingBox(this_00);
      this_00->Type = EAMT_OBJ;
      piVar2 = (int *)((long)paVar23 + *(long *)(paVar23->_M_allocated_capacity - 0x18) + 0x10);
      *piVar2 = *piVar2 + 1;
      local_238._M_allocated_capacity = (size_type)paVar23;
      core::array<irr::scene::IMesh_*>::push_back
                (&this_00->Meshes,(IMesh **)&local_238._M_allocated_capacity);
      SAnimatedMesh::recalculateBoundingBox(this_00);
    }
    operator_delete__(local_370);
    cleanUp(this);
    lVar21 = *(long *)(paVar23->_M_allocated_capacity - 0x18);
    piVar2 = (int *)((long)paVar23 + lVar21 + 0x10);
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      plVar15 = (long *)((long)paVar23 + lVar21);
      (**(code **)(*plVar15 + 8))(plVar15);
    }
LAB_001b3d59:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278.str._M_dataplus._M_p != &local_278.str.field_2) {
      operator_delete(local_278.str._M_dataplus._M_p,
                      CONCAT71(local_278.str.field_2._M_allocated_capacity._1_7_,
                               local_278.str.field_2._M_local_buf[0]) + 1);
    }
    if (local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (int *)0x0) {
      operator_delete(local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_368.m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_allocated_capacity != &local_2a8) {
      operator_delete((void *)local_2b8._M_allocated_capacity,
                      CONCAT71(local_2a8._M_allocated_capacity._1_7_,local_2a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_allocated_capacity != &local_288) {
      operator_delete((void *)local_298._M_allocated_capacity,
                      CONCAT71(local_288._M_allocated_capacity._1_7_,local_288._M_local_buf[0]) + 1)
      ;
    }
    if (local_258 != &local_248) {
      operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
    }
    if (local_308.m_data.
        super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_308.m_data.
                      super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_308.m_data.
                            super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_308.m_data.
                            super__Vector_base<irr::core::vector2d<float>,_std::allocator<irr::core::vector2d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_348.
        super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.
                      super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_348.
                            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.
                            super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_328.
        super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return (IAnimatedMesh *)this_00;
    }
    operator_delete(local_328.
                    super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_328.
                          super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.
                          super__Vector_base<irr::core::vector3d<float>,_std::allocator<irr::core::vector3d<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    return (IAnimatedMesh *)this_00;
  }
  goto LAB_001b31fe;
  while (_Var37._M_p = _Var37._M_p + 1, paVar38 = paVar18,
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var37._M_p != paVar23) {
LAB_001b371b:
    if ((4 < (byte)*_Var37._M_p - 9) &&
       (paVar38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var37._M_p, *_Var37._M_p != 0x20)) break;
  }
LAB_001b373b:
  _Var37._M_p = (pointer)paVar38;
  if (paVar38->_M_local_buf[0] == '\0') goto LAB_001b3745;
  goto LAB_001b342d;
  while (inBuf = inBuf + 1, pbVar36 = pbVar22, inBuf != bufEnd) {
LAB_001b3a53:
    if ((4 < *inBuf - 9) && (pbVar36 = inBuf, *inBuf != 0x20)) break;
  }
  goto LAB_001b3a74;
}

Assistant:

IAnimatedMesh *COBJMeshFileLoader::createMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	const long filesize = file->getSize();
	if (!filesize)
		return 0;

	const u32 WORD_BUFFER_LENGTH = 512;

	core::array<core::vector3df> vertexBuffer(1000);
	core::array<core::vector3df> normalsBuffer(1000);
	core::array<core::vector2df> textureCoordBuffer(1000);

	SObjMtl *currMtl = new SObjMtl();
	Materials.push_back(currMtl);
	u32 smoothingGroup = 0;

	const io::path fullName = file->getFileName();

	c8 *buf = new c8[filesize + 1]; // plus null-terminator
	memset(buf, 0, filesize + 1);
	file->read((void *)buf, filesize);
	const c8 *const bufEnd = buf + filesize;

	// Process obj information
	const c8 *bufPtr = buf;
	core::stringc grpName, mtlName;
	bool mtlChanged = false;
	bool useGroups = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_GROUPS);
	bool useMaterials = !SceneManager->getParameters()->getAttributeAsBool(OBJ_LOADER_IGNORE_MATERIAL_FILES);
	[[maybe_unused]] irr::u32 lineNr = 1; // only counts non-empty lines, still useful in debugging to locate errors
	core::array<int> faceCorners;
	faceCorners.reallocate(32); // should be large enough
	const core::stringc TAG_OFF = "off";
	irr::u32 degeneratedFaces = 0;

	while (bufPtr != bufEnd) {
		switch (bufPtr[0]) {
		case 'm': // mtllib (material)
		{
			if (useMaterials) {
				c8 name[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(name, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Ignoring material file", name);
#endif
			}
		} break;

		case 'v': // v, vn, vt
			switch (bufPtr[1]) {
			case ' ': // vertex
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				vertexBuffer.push_back(vec);
			} break;

			case 'n': // normal
			{
				core::vector3df vec;
				bufPtr = readVec3(bufPtr, vec, bufEnd);
				normalsBuffer.push_back(vec);
			} break;

			case 't': // texcoord
			{
				core::vector2df vec;
				bufPtr = readUV(bufPtr, vec, bufEnd);
				textureCoordBuffer.push_back(vec);
			} break;
			}
			break;

		case 'g': // group name
		{
			c8 grp[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(grp, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded group start", grp, ELL_DEBUG);
#endif
			if (useGroups) {
				if (0 != grp[0])
					grpName = grp;
				else
					grpName = "default";
			}
			mtlChanged = true;
		} break;

		case 's': // smoothing can be a group or off (equiv. to 0)
		{
			c8 smooth[WORD_BUFFER_LENGTH];
			bufPtr = goAndCopyNextWord(smooth, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
			os::Printer::log("Loaded smoothing group start", smooth, ELL_DEBUG);
#endif
			if (TAG_OFF == smooth)
				smoothingGroup = 0;
			else
				smoothingGroup = core::strtoul10(smooth);

			(void)smoothingGroup; // disable unused variable warnings
		} break;

		case 'u': // usemtl
			// get name of material
			{
				c8 matName[WORD_BUFFER_LENGTH];
				bufPtr = goAndCopyNextWord(matName, bufPtr, WORD_BUFFER_LENGTH, bufEnd);
#ifdef _IRR_DEBUG_OBJ_LOADER_
				os::Printer::log("Loaded material start", matName, ELL_DEBUG);
#endif
				mtlName = matName;
				mtlChanged = true;
			}
			break;

		case 'f': // face
		{
			c8 vertexWord[WORD_BUFFER_LENGTH]; // for retrieving vertex data
			video::S3DVertex v;
			// Assign vertex color from currently active material's diffuse color
			if (mtlChanged) {
				// retrieve the material
				SObjMtl *useMtl = findMtl(mtlName, grpName);
				// only change material if we found it
				if (useMtl)
					currMtl = useMtl;
				mtlChanged = false;
			}
			if (currMtl)
				v.Color = currMtl->Meshbuffer->Material.DiffuseColor;

			// get all vertices data in this face (current line of obj file)
			const core::stringc wordBuffer = copyLine(bufPtr, bufEnd);
			const c8 *linePtr = wordBuffer.c_str();
			const c8 *const endPtr = linePtr + wordBuffer.size();

			faceCorners.set_used(0); // fast clear

			// read in all vertices
			linePtr = goNextWord(linePtr, endPtr);
			while (0 != linePtr[0]) {
				// Array to communicate with retrieveVertexIndices()
				// sends the buffer sizes and gets the actual indices
				// if index not set returns -1
				s32 Idx[3];
				Idx[0] = Idx[1] = Idx[2] = -1;

				// read in next vertex's data
				u32 wlength = copyWord(vertexWord, linePtr, WORD_BUFFER_LENGTH, endPtr);
				// this function will also convert obj's 1-based index to c++'s 0-based index
				retrieveVertexIndices(vertexWord, Idx, vertexWord + wlength + 1, vertexBuffer.size(), textureCoordBuffer.size(), normalsBuffer.size());
				if (Idx[0] >= 0 && Idx[0] < (irr::s32)vertexBuffer.size())
					v.Pos = vertexBuffer[Idx[0]];
				else {
					os::Printer::log("Invalid vertex index in this line", wordBuffer.c_str(), ELL_ERROR);
					delete[] buf;
					cleanUp();
					return 0;
				}
				if (Idx[1] >= 0 && Idx[1] < (irr::s32)textureCoordBuffer.size())
					v.TCoords = textureCoordBuffer[Idx[1]];
				else
					v.TCoords.set(0.0f, 0.0f);
				if (Idx[2] >= 0 && Idx[2] < (irr::s32)normalsBuffer.size())
					v.Normal = normalsBuffer[Idx[2]];
				else {
					v.Normal.set(0.0f, 0.0f, 0.0f);
					currMtl->RecalculateNormals = true;
				}

				int vertLocation;
				auto n = currMtl->VertMap.find(v);
				if (n != currMtl->VertMap.end()) {
					vertLocation = n->second;
				} else {
					currMtl->Meshbuffer->Vertices.push_back(v);
					vertLocation = currMtl->Meshbuffer->Vertices.size() - 1;
					currMtl->VertMap.emplace(v, vertLocation);
				}

				faceCorners.push_back(vertLocation);

				// go to next vertex
				linePtr = goNextWord(linePtr, endPtr);
			}

			if (faceCorners.size() < 3) {
				os::Printer::log("Too few vertices in this line", wordBuffer.c_str(), ELL_ERROR);
				delete[] buf;
				cleanUp();
				return 0;
			}

			// triangulate the face
			const int c = faceCorners[0];
			for (u32 i = 1; i < faceCorners.size() - 1; ++i) {
				// Add a triangle
				const int a = faceCorners[i + 1];
				const int b = faceCorners[i];
				if (a != b && a != c && b != c) { // ignore degenerated faces. We can get them when we merge vertices above in the VertMap.
					currMtl->Meshbuffer->Indices.push_back(a);
					currMtl->Meshbuffer->Indices.push_back(b);
					currMtl->Meshbuffer->Indices.push_back(c);
				} else {
					++degeneratedFaces;
				}
			}
		} break;

		case '#': // comment
		default:
			break;
		} // end switch(bufPtr[0])
		// eat up rest of line
		bufPtr = goNextLine(bufPtr, bufEnd);
		++lineNr;
	} // end while(bufPtr && (bufPtr-buf<filesize))

	if (degeneratedFaces > 0) {
		irr::core::stringc log(degeneratedFaces);
		log += " degenerated faces removed in ";
		log += irr::core::stringc(fullName);
		os::Printer::log(log.c_str(), ELL_INFORMATION);
	}

	SMesh *mesh = new SMesh();

	// Combine all the groups (meshbuffers) into the mesh
	for (u32 m = 0; m < Materials.size(); ++m) {
		if (Materials[m]->Meshbuffer->getIndexCount() > 0) {
			Materials[m]->Meshbuffer->recalculateBoundingBox();
			if (Materials[m]->RecalculateNormals)
				SceneManager->getMeshManipulator()->recalculateNormals(Materials[m]->Meshbuffer);
			mesh->addMeshBuffer(Materials[m]->Meshbuffer);
		}
	}

	// Create the Animated mesh if there's anything in the mesh
	SAnimatedMesh *animMesh = 0;
	if (0 != mesh->getMeshBufferCount()) {
		mesh->recalculateBoundingBox();
		animMesh = new SAnimatedMesh();
		animMesh->Type = EAMT_OBJ;
		animMesh->addMesh(mesh);
		animMesh->recalculateBoundingBox();
	}

	// Clean up the allocate obj file contents
	delete[] buf;
	// more cleaning up
	cleanUp();
	mesh->drop();

	return animMesh;
}